

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Stress::anon_unknown_0::RandomGroup::init(RandomGroup *this,EVP_PKEY_CTX *ctx)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  TestContext *testCtx;
  RenderContext *renderCtx;
  _Rb_tree_color _Var3;
  DrawTest *pDVar4;
  long *name;
  undefined4 uVar5;
  bool bVar6;
  int i;
  int iVar7;
  deUint32 dVar8;
  deBool dVar9;
  int iVar10;
  CompatibilityTestType CVar11;
  int extraout_EAX;
  long lVar12;
  _Base_ptr p_Var13;
  int i_2;
  _Rb_tree_header *p_Var14;
  uint uVar15;
  ulong uVar16;
  deUint32 hash;
  Storage storages [2];
  DrawTestSpec spec;
  UniformWeightArray<2> storageWeights;
  IndexType indexTypes [3];
  int firsts [3];
  int indexOffsets [3];
  int primitiveCounts [3];
  int attribCounts [3];
  float firstWeights [3];
  float indexOffsetWeights [3];
  float primitiveCountWeights [3];
  float attribWeights [3];
  DrawMethod drawMethods [5];
  int instanceDivisors [4];
  int strides [4];
  int offsets [4];
  float indexWeights [4];
  int indexMaxs [4];
  int indexMins [4];
  int instanceCounts [4];
  UniformWeightArray<3> indexTypeWeights;
  Primitive primitives [7];
  Usage usages [9];
  float instanceDivisorWeights [4];
  float strideWeights [4];
  float offsetWeights [4];
  float instanceWeights [4];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> insertedHashes;
  InputType inputTypes [11];
  OutputType outputTypes [12];
  UniformWeightArray<5> drawMethodWeights;
  AttributeSpec attribSpec;
  UniformWeightArray<7> primitiveWeights;
  Random random;
  UniformWeightArray<9> usageWeights;
  UniformWeightArray<11> inputTypeWeights;
  UniformWeightArray<12> outputTypeWeights;
  _Rb_tree_color local_56c;
  DrawTest *local_568;
  Storage local_560 [2];
  ulong local_558;
  TestNode *local_550;
  long local_548;
  undefined1 local_540 [56];
  pointer local_508;
  iterator local_500;
  AttributeSpec *local_4f8;
  float local_4f0 [2];
  IndexType local_4e8 [4];
  int local_4d8 [4];
  int local_4c8 [4];
  int local_4b8 [4];
  int local_4a8 [4];
  long *local_498;
  long local_488 [2];
  float local_478 [4];
  float local_468 [4];
  float local_458 [4];
  float local_448 [4];
  DrawMethod local_438 [8];
  int local_418 [12];
  float local_3e8 [4];
  int local_3d8 [13];
  float local_3a4 [3];
  Primitive local_398 [8];
  Usage local_378 [12];
  float local_348 [16];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_308;
  InputType local_2d8 [12];
  OutputType local_2a8 [15];
  float local_26c [5];
  undefined1 local_258 [28];
  bool bStack_23c;
  undefined3 uStack_23b;
  int local_238;
  bool bStack_234;
  undefined3 uStack_233;
  ios_base local_1e8 [268];
  float local_dc [7];
  deRandom local_c0;
  float local_b0 [9];
  float local_8c [11];
  float local_60 [12];
  
  local_4a8[0] = 1;
  local_4a8[1] = 2;
  local_4a8[2] = 5;
  local_448[2] = 1.0;
  local_448[0] = 30.0;
  local_448[1] = 10.0;
  local_4b8[0] = 1;
  local_4b8[1] = 5;
  local_4b8[2] = 0x40;
  local_458[2] = 1.0;
  local_458[0] = 20.0;
  local_458[1] = 10.0;
  local_4c8[2] = 0xd;
  local_4c8[0] = 0;
  local_4c8[1] = 7;
  local_468[2] = 1.0;
  local_468[0] = 20.0;
  local_468[1] = 20.0;
  local_4d8[2] = 0xd;
  local_4d8[0] = 0;
  local_4d8[1] = 7;
  local_478[2] = 1.0;
  local_478[0] = 20.0;
  local_478[1] = 20.0;
  local_3d8[8] = 1;
  local_3d8[9] = 2;
  local_3d8[10] = 0x10;
  local_3d8[0xb] = 0x11;
  local_348[0xc] = 20.0;
  local_348[0xd] = 10.0;
  local_348[0xe] = 5.0;
  local_348[0xf] = 1.0;
  local_3d8[4] = 0;
  local_3d8[5] = 1;
  local_3d8[6] = 3;
  local_3d8[7] = 8;
  local_3d8[0] = 4;
  local_3d8[1] = 8;
  local_3d8[2] = 0x80;
  local_3d8[3] = 0x101;
  local_3e8[0] = 50.0;
  local_3e8[1] = 50.0;
  local_3e8[2] = 50.0;
  local_3e8[3] = 50.0;
  local_418[8] = 0;
  local_418[9] = 1;
  local_418[10] = 5;
  local_418[0xb] = 0xc;
  local_348[8] = 50.0;
  local_348[9] = 10.0;
  local_348[10] = 10.0;
  local_348[0xb] = 10.0;
  local_418[4] = 0;
  local_418[5] = 7;
  local_418[6] = 0x10;
  local_418[7] = 0x11;
  local_348[4] = 50.0;
  local_348[5] = 10.0;
  local_348[6] = 10.0;
  local_348[7] = 10.0;
  local_418[0] = 0;
  local_418[1] = 1;
  local_418[2] = 3;
  local_418[3] = 0x81;
  local_348[0] = 70.0;
  local_348[1] = 30.0;
  local_348[2] = 10.0;
  local_348[3] = 10.0;
  local_398[4] = 4;
  local_398[5] = PRIMITIVE_LINE_STRIP;
  local_398[6] = PRIMITIVE_LINE_LOOP;
  local_398[0] = PRIMITIVE_POINTS;
  local_398[1] = PRIMITIVE_TRIANGLES;
  local_398[2] = 2;
  local_398[3] = 3;
  lVar12 = 0;
  do {
    local_dc[lVar12] = 1.0;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 7);
  local_438[0] = DRAWMETHOD_DRAWARRAYS;
  local_438[1] = DRAWMETHOD_DRAWARRAYS_INSTANCED;
  local_438[2] = DRAWMETHOD_DRAWELEMENTS;
  local_438[3] = DRAWMETHOD_DRAWELEMENTS_RANGED;
  local_438[4] = 5;
  lVar12 = 0;
  do {
    local_26c[lVar12] = 1.0;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 5);
  local_4e8[0] = INDEXTYPE_BYTE;
  local_4e8[1] = INDEXTYPE_SHORT;
  local_4e8[2] = 2;
  lVar12 = 0;
  do {
    local_3a4[lVar12] = 1.0;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_560[0] = STORAGE_USER;
  local_560[1] = STORAGE_BUFFER;
  lVar12 = 0;
  do {
    local_4f0[lVar12] = 1.0;
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  local_2d8[8] = 9;
  local_2d8[9] = INPUTTYPE_UNSIGNED_INT_2_10_10_10;
  local_2d8[10] = INPUTTYPE_INT_2_10_10_10;
  local_2d8[4] = INPUTTYPE_UNSIGNED_BYTE;
  local_2d8[5] = INPUTTYPE_UNSIGNED_SHORT;
  local_2d8[6] = 7;
  local_2d8[7] = 8;
  local_2d8[0] = INPUTTYPE_FLOAT;
  local_2d8[1] = INPUTTYPE_FIXED;
  local_2d8[2] = INPUTTYPE_BYTE;
  local_2d8[3] = INPUTTYPE_SHORT;
  lVar12 = 0;
  do {
    local_8c[lVar12] = 1.0;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0xb);
  local_2a8[8] = OUTPUTTYPE_IVEC4;
  local_2a8[9] = OUTPUTTYPE_UVEC2;
  local_2a8[10] = OUTPUTTYPE_UVEC3;
  local_2a8[0xb] = OUTPUTTYPE_UVEC4;
  local_2a8[4] = OUTPUTTYPE_INT;
  local_2a8[5] = OUTPUTTYPE_UINT;
  local_2a8[6] = OUTPUTTYPE_IVEC2;
  local_2a8[7] = OUTPUTTYPE_IVEC3;
  local_2a8[0] = OUTPUTTYPE_FLOAT;
  local_2a8[1] = OUTPUTTYPE_VEC2;
  local_2a8[2] = OUTPUTTYPE_VEC3;
  local_2a8[3] = OUTPUTTYPE_VEC4;
  lVar12 = 0;
  do {
    local_60[lVar12] = 1.0;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0xc);
  local_378[4] = USAGE_STREAM_COPY;
  local_378[5] = USAGE_STATIC_READ;
  local_378[6] = USAGE_STATIC_COPY;
  local_378[7] = USAGE_DYNAMIC_READ;
  local_378[0] = USAGE_DYNAMIC_DRAW;
  local_378[1] = USAGE_STATIC_DRAW;
  local_378[2] = USAGE_STREAM_DRAW;
  local_378[3] = USAGE_STREAM_READ;
  local_378[8] = 8;
  lVar12 = 0;
  do {
    local_b0[lVar12] = 1.0;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 9);
  local_308._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_308._M_impl.super__Rb_tree_header._M_header;
  local_308._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar16 = 0;
  local_308._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_308._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_548 = 0;
  local_550 = (TestNode *)this;
  local_308._M_impl.super__Rb_tree_header._M_header._M_right =
       local_308._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    deRandom_init(&local_c0,(int)uVar16 + 0xc551393);
    iVar7 = de::Random::chooseWeighted<int,int_const*,float_const*>
                      ((Random *)&local_c0,local_4a8,local_4a8 + 3,local_448);
    deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_540);
    local_540._0_4_ = 3;
    local_540._4_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Primitive,deqp::gls::DrawTestSpec::Primitive*,float_const*>
                   ((Random *)&local_c0,local_398,local_398 + 7,local_dc);
    local_540._8_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_c0,local_4b8,local_4b8 + 3,local_458);
    local_540._12_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::DrawMethod,deqp::gls::DrawTestSpec::DrawMethod*,float_const*>
                   ((Random *)&local_c0,local_438,local_438 + 5,local_26c);
    local_540._16_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::IndexType,deqp::gls::DrawTestSpec::IndexType*,float_const*>
                   ((Random *)&local_c0,local_4e8,local_4e8 + 3,local_3a4);
    local_540._20_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_c0,local_4c8,local_4c8 + 3,local_468);
    local_540._24_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage*,float_const*>
                   ((Random *)&local_c0,local_560,(Storage *)&local_558,local_4f0);
    local_540._28_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_c0,local_4d8,local_4d8 + 3,local_478);
    local_540._32_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_c0,local_3d8 + 4,local_3d8 + 8,local_3e8);
    local_540._36_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_c0,local_3d8,local_3d8 + 4,local_3e8);
    local_540._40_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_c0,local_3d8 + 8,local_3d8 + 0xc,local_348 + 0xc);
    bVar6 = deqp::gls::DrawTestSpec::valid((DrawTestSpec *)local_540);
    if (bVar6) {
      local_568 = (DrawTest *)CONCAT44(local_568._4_4_,iVar7);
      local_558 = uVar16;
      if (0 < iVar7) {
        iVar7 = 0;
        do {
          deqp::gls::DrawTestSpec::AttributeSpec::AttributeSpec((AttributeSpec *)local_258);
          local_258._0_4_ =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::InputType,deqp::gls::DrawTestSpec::InputType*,float_const*>
                         ((Random *)&local_c0,local_2d8,local_2d8 + 0xb,local_8c);
          local_258._4_4_ =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::OutputType,deqp::gls::DrawTestSpec::OutputType*,float_const*>
                         ((Random *)&local_c0,local_2a8,local_2a8 + 0xc,local_60);
          local_258._8_4_ =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage*,float_const*>
                         ((Random *)&local_c0,local_560,(Storage *)&local_558,local_4f0);
          local_258._12_4_ =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::Usage,deqp::gls::DrawTestSpec::Usage*,float_const*>
                         ((Random *)&local_c0,local_378,local_378 + 9,local_b0);
          dVar8 = deRandom_getUint32(&local_c0);
          local_258._16_4_ = (dVar8 & 3) + 1;
          local_258._20_4_ =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)&local_c0,local_418 + 8,(int *)local_3e8,local_348 + 8);
          local_258._24_4_ =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)&local_c0,local_418 + 4,local_418 + 8,local_348 + 4);
          dVar9 = deRandom_getBool(&local_c0);
          bStack_23c = dVar9 == 1;
          local_238 = de::Random::chooseWeighted<int,int_const*,float_const*>
                                ((Random *)&local_c0,local_418,local_418 + 4,local_348);
          dVar9 = deRandom_getBool(&local_c0);
          bStack_234 = dVar9 == 1;
          bVar6 = deqp::gls::DrawTestSpec::AttributeSpec::valid
                            ((AttributeSpec *)local_258,(ApiType)local_540._0_4_);
          uVar5 = local_258._16_4_;
          if (local_258._24_4_ != 0) {
            iVar10 = deqp::gls::DrawTestSpec::inputTypeSize(local_258._0_4_);
            bVar6 = bVar6 && iVar10 * uVar5 <= (int)local_258._24_4_;
          }
          if (bVar6 != false) {
            if (local_500._M_current == local_4f8) {
              std::
              vector<deqp::gls::DrawTestSpec::AttributeSpec,std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>>
              ::_M_realloc_insert<deqp::gls::DrawTestSpec::AttributeSpec_const&>
                        ((vector<deqp::gls::DrawTestSpec::AttributeSpec,std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>>
                          *)&local_508,local_500,(AttributeSpec *)local_258);
            }
            else {
              (local_500._M_current)->instanceDivisor = local_238;
              (local_500._M_current)->useDefaultAttribute = (bool)(char)_bStack_234;
              (local_500._M_current)->additionalPositionAttribute = (bool)SUB41(_bStack_234,1);
              (local_500._M_current)->bgraComponentOrder = (bool)SUB41(_bStack_234,2);
              (local_500._M_current)->field_0x27 = SUB41(_bStack_234,3);
              (local_500._M_current)->componentCount = local_258._16_4_;
              (local_500._M_current)->offset = local_258._20_4_;
              (local_500._M_current)->stride = local_258._24_4_;
              (local_500._M_current)->normalize = (bool)(char)_bStack_23c;
              *(int3 *)&(local_500._M_current)->field_0x1d = (int3)((uint)_bStack_23c >> 8);
              (local_500._M_current)->inputType = local_258._0_4_;
              (local_500._M_current)->outputType = local_258._4_4_;
              (local_500._M_current)->storage = local_258._8_4_;
              (local_500._M_current)->usage = local_258._12_4_;
              local_500._M_current = local_500._M_current + 1;
            }
            iVar7 = iVar7 + 1;
          }
        } while (iVar7 < (int)local_568);
      }
      pDVar4 = local_568;
      if (local_540._4_4_ != PRIMITIVE_POINTS) {
        local_508->instanceDivisor = 0;
      }
      iVar7 = (int)local_568;
      uVar16 = local_558;
      if (((((local_540._12_4_ != DRAWMETHOD_DRAWELEMENTS_RANGED) ||
            (local_540._4_4_ == PRIMITIVE_POINTS)) || (local_540._32_4_ != local_540._36_4_)) &&
          ((local_540._4_4_ == PRIMITIVE_POINTS || (local_508->useDefaultAttribute == false)))) &&
         ((2 < local_540._4_4_ - PRIMITIVE_TRIANGLES ||
          (((local_508->componentCount != 1 &&
            ((OUTPUTTYPE_UINT < local_508->outputType ||
             ((0x31U >> (local_508->outputType & 0x1f) & 1) == 0)))) &&
           ((local_540._12_4_ != DRAWMETHOD_DRAWELEMENTS_RANGED ||
            (1 < (int)(local_540._36_4_ - local_540._32_4_))))))))) {
        local_56c = deqp::gls::DrawTestSpec::hash((DrawTestSpec *)local_540);
        if (0 < iVar7) {
          lVar12 = 0;
          do {
            _Var3 = local_56c;
            local_56c = deqp::gls::DrawTestSpec::AttributeSpec::hash
                                  ((AttributeSpec *)((long)&local_508->inputType + lVar12));
            local_56c = local_56c ^ _Var3 << 2;
            lVar12 = lVar12 + 0x28;
          } while (((ulong)pDVar4 & 0xffffffff) * 0x28 != lVar12);
        }
        uVar16 = local_558;
        p_Var1 = &local_308._M_impl.super__Rb_tree_header;
        p_Var13 = &p_Var1->_M_header;
        for (p_Var2 = local_308._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0; p_Var2 = (&p_Var2->_M_left)[bVar6])
        {
          bVar6 = (_Rb_tree_color)*(size_t *)(p_Var2 + 1) < local_56c;
          if (!bVar6) {
            p_Var13 = p_Var2;
          }
        }
        p_Var14 = p_Var1;
        if (((_Rb_tree_header *)p_Var13 != p_Var1) &&
           (p_Var14 = (_Rb_tree_header *)p_Var13,
           local_56c < (_Rb_tree_color)((_Rb_tree_header *)p_Var13)->_M_node_count)) {
          p_Var14 = p_Var1;
        }
        if (p_Var14 == p_Var1) {
          CVar11 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_540);
          if ((CVar11 == COMPATIBILITY_UNALIGNED_OFFSET) ||
             (CVar11 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_540),
             CVar11 == COMPATIBILITY_UNALIGNED_STRIDE)) {
            local_568 = (DrawTest *)operator_new(0x138);
            testCtx = local_550->m_testCtx;
            renderCtx = ((Context *)local_550[1]._vptr_TestNode)->m_renderCtx;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
            std::ostream::_M_insert<unsigned_long>((ulong)local_258);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
            std::ios_base::~ios_base(local_1e8);
            name = local_498;
            deqp::gls::DrawTestSpec::getDesc_abi_cxx11_
                      ((string *)local_258,(DrawTestSpec *)local_540);
            pDVar4 = local_568;
            deqp::gls::DrawTest::DrawTest
                      (local_568,testCtx,renderCtx,(DrawTestSpec *)local_540,(char *)name,
                       (char *)CONCAT44(local_258._4_4_,local_258._0_4_));
            tcu::TestNode::addChild(local_550,(TestNode *)pDVar4);
            uVar16 = local_558;
            if ((undefined1 *)CONCAT44(local_258._4_4_,local_258._0_4_) != local_258 + 0x10) {
              operator_delete((undefined1 *)CONCAT44(local_258._4_4_,local_258._0_4_),
                              CONCAT44(local_258._20_4_,local_258._16_4_) + 1);
            }
            if (local_498 != local_488) {
              operator_delete(local_498,local_488[0] + 1);
            }
          }
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&local_308,&local_56c);
          local_548 = local_548 + 1;
        }
      }
    }
    if (local_508 != (pointer)0x0) {
      operator_delete(local_508,(long)local_4f8 - (long)local_508);
    }
    uVar15 = (int)uVar16 + 1;
    uVar16 = (ulong)uVar15;
  } while (uVar15 != 300);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_308);
  return extraout_EAX;
}

Assistant:

void RandomGroup::init (void)
{
	const int	numAttempts				= 300;

	const int	attribCounts[]			= { 1, 2, 5 };
	const float	attribWeights[]			= { 30, 10, 1 };
	const int	primitiveCounts[]		= { 1, 5, 64 };
	const float	primitiveCountWeights[]	= { 20, 10, 1 };
	const int	indexOffsets[]			= { 0, 7, 13 };
	const float	indexOffsetWeights[]	= { 20, 20, 1 };
	const int	firsts[]				= { 0, 7, 13 };
	const float	firstWeights[]			= { 20, 20, 1 };
	const int	instanceCounts[]		= { 1, 2, 16, 17 };
	const float	instanceWeights[]		= { 20, 10, 5, 1 };
	const int	indexMins[]				= { 0, 1, 3, 8 };
	const int	indexMaxs[]				= { 4, 8, 128, 257 };
	const float	indexWeights[]			= { 50, 50, 50, 50 };
	const int	offsets[]				= { 0, 1, 5, 12 };
	const float	offsetWeights[]			= { 50, 10, 10, 10 };
	const int	strides[]				= { 0, 7, 16, 17 };
	const float	strideWeights[]			= { 50, 10, 10, 10 };
	const int	instanceDivisors[]		= { 0, 1, 3, 129 };
	const float	instanceDivisorWeights[]= { 70, 30, 10, 10 };

	gls::DrawTestSpec::Primitive primitives[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(primitives)> primitiveWeights;

	gls::DrawTestSpec::DrawMethod drawMethods[] =
	{
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(drawMethods)> drawMethodWeights;

	gls::DrawTestSpec::IndexType indexTypes[] =
	{
		gls::DrawTestSpec::INDEXTYPE_BYTE,
		gls::DrawTestSpec::INDEXTYPE_SHORT,
		gls::DrawTestSpec::INDEXTYPE_INT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(indexTypes)> indexTypeWeights;

	gls::DrawTestSpec::Storage storages[] =
	{
		gls::DrawTestSpec::STORAGE_USER,
		gls::DrawTestSpec::STORAGE_BUFFER,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(storages)> storageWeights;

	gls::DrawTestSpec::InputType inputTypes[] =
	{
		gls::DrawTestSpec::INPUTTYPE_FLOAT,
		gls::DrawTestSpec::INPUTTYPE_FIXED,
		gls::DrawTestSpec::INPUTTYPE_BYTE,
		gls::DrawTestSpec::INPUTTYPE_SHORT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT,
		gls::DrawTestSpec::INPUTTYPE_INT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT,
		gls::DrawTestSpec::INPUTTYPE_HALF,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10,
		gls::DrawTestSpec::INPUTTYPE_INT_2_10_10_10,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(inputTypes)> inputTypeWeights;

	gls::DrawTestSpec::OutputType outputTypes[] =
	{
		gls::DrawTestSpec::OUTPUTTYPE_FLOAT,
		gls::DrawTestSpec::OUTPUTTYPE_VEC2,
		gls::DrawTestSpec::OUTPUTTYPE_VEC3,
		gls::DrawTestSpec::OUTPUTTYPE_VEC4,
		gls::DrawTestSpec::OUTPUTTYPE_INT,
		gls::DrawTestSpec::OUTPUTTYPE_UINT,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC4,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC4,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(outputTypes)> outputTypeWeights;

	gls::DrawTestSpec::Usage usages[] =
	{
		gls::DrawTestSpec::USAGE_DYNAMIC_DRAW,
		gls::DrawTestSpec::USAGE_STATIC_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_READ,
		gls::DrawTestSpec::USAGE_STREAM_COPY,
		gls::DrawTestSpec::USAGE_STATIC_READ,
		gls::DrawTestSpec::USAGE_STATIC_COPY,
		gls::DrawTestSpec::USAGE_DYNAMIC_READ,
		gls::DrawTestSpec::USAGE_DYNAMIC_COPY,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(usages)> usageWeights;

	std::set<deUint32>	insertedHashes;
	size_t				insertedCount = 0;

	for (int ndx = 0; ndx < numAttempts; ++ndx)
	{
		de::Random random(0xc551393 + ndx); // random does not depend on previous cases

		int					attributeCount = random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(attribCounts), DE_ARRAY_END(attribCounts), attribWeights);
		gls::DrawTestSpec	spec;

		spec.apiType				= glu::ApiType::es(3,0);
		spec.primitive				= random.chooseWeighted<gls::DrawTestSpec::Primitive>	(DE_ARRAY_BEGIN(primitives),		DE_ARRAY_END(primitives),		primitiveWeights.weights);
		spec.primitiveCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(primitiveCounts),	DE_ARRAY_END(primitiveCounts),	primitiveCountWeights);
		spec.drawMethod				= random.chooseWeighted<gls::DrawTestSpec::DrawMethod>	(DE_ARRAY_BEGIN(drawMethods),		DE_ARRAY_END(drawMethods),		drawMethodWeights.weights);
		spec.indexType				= random.chooseWeighted<gls::DrawTestSpec::IndexType>	(DE_ARRAY_BEGIN(indexTypes),		DE_ARRAY_END(indexTypes),		indexTypeWeights.weights);
		spec.indexPointerOffset		= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexOffsets),		DE_ARRAY_END(indexOffsets),		indexOffsetWeights);
		spec.indexStorage			= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
		spec.first					= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(firsts),			DE_ARRAY_END(firsts),			firstWeights);
		spec.indexMin				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMins),			DE_ARRAY_END(indexMins),		indexWeights);
		spec.indexMax				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMaxs),			DE_ARRAY_END(indexMaxs),		indexWeights);
		spec.instanceCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(instanceCounts),	DE_ARRAY_END(instanceCounts),	instanceWeights);

		// check spec is legal
		if (!spec.valid())
			continue;

		for (int attrNdx = 0; attrNdx < attributeCount;)
		{
			bool valid;
			gls::DrawTestSpec::AttributeSpec attribSpec;

			attribSpec.inputType			= random.chooseWeighted<gls::DrawTestSpec::InputType>	(DE_ARRAY_BEGIN(inputTypes),		DE_ARRAY_END(inputTypes),		inputTypeWeights.weights);
			attribSpec.outputType			= random.chooseWeighted<gls::DrawTestSpec::OutputType>	(DE_ARRAY_BEGIN(outputTypes),		DE_ARRAY_END(outputTypes),		outputTypeWeights.weights);
			attribSpec.storage				= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
			attribSpec.usage				= random.chooseWeighted<gls::DrawTestSpec::Usage>		(DE_ARRAY_BEGIN(usages),			DE_ARRAY_END(usages),			usageWeights.weights);
			attribSpec.componentCount		= random.getInt(1, 4);
			attribSpec.offset				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(offsets), DE_ARRAY_END(offsets), offsetWeights);
			attribSpec.stride				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(strides), DE_ARRAY_END(strides), strideWeights);
			attribSpec.normalize			= random.getBool();
			attribSpec.instanceDivisor		= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(instanceDivisors), DE_ARRAY_END(instanceDivisors), instanceDivisorWeights);
			attribSpec.useDefaultAttribute	= random.getBool();

			// check spec is legal
			valid = attribSpec.valid(spec.apiType);

			// we do not want interleaved elements. (Might result in some weird floating point values)
			if (attribSpec.stride && attribSpec.componentCount * gls::DrawTestSpec::inputTypeSize(attribSpec.inputType) > attribSpec.stride)
				valid = false;

			// try again if not valid
			if (valid)
			{
				spec.attribs.push_back(attribSpec);
				++attrNdx;
			}
		}

		// Do not collapse all vertex positions to a single positions
		if (spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
			spec.attribs[0].instanceDivisor = 0;

		// Is render result meaningful?
		{
			// Only one vertex
			if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && spec.indexMin == spec.indexMax && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;
			if (spec.attribs[0].useDefaultAttribute && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;

			// Triangle only on one axis
			if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLES || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP)
			{
				if (spec.attribs[0].componentCount == 1)
					continue;
				if (spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_FLOAT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_INT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_UINT)
					continue;
				if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && (spec.indexMax - spec.indexMin) < 2)
					continue;
			}
		}

		// Add case
		{
			deUint32 hash = spec.hash();
			for (int attrNdx = 0; attrNdx < attributeCount; ++attrNdx)
				hash = (hash << 2) ^ (deUint32)spec.attribs[attrNdx].hash();

			if (insertedHashes.find(hash) == insertedHashes.end())
			{
				// Only unaligned cases
				if (spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET ||
					spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
					this->addChild(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), spec, de::toString(insertedCount).c_str(), spec.getDesc().c_str()));
				insertedHashes.insert(hash);

				++insertedCount;
			}
		}
	}
}